

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoalSymbol.h
# Opt level: O3

void __thiscall GoalSymbol::set_type(GoalSymbol *this,TypeSpec *ts)

{
  pointer pcVar1;
  pointer pTVar2;
  bool bVar3;
  string local_68;
  string local_40;
  
  if (this->m_has_type_info == true) {
    bVar3 = TypeSpec::operator!=(ts,&this->m_type);
    if (bVar3) {
      pcVar1 = (this->m_name)._M_dataplus._M_p;
      TypeSpec::to_string_abi_cxx11_(&local_68,&this->m_type);
      TypeSpec::to_string_abi_cxx11_(&local_40,ts);
      printf("symbol %s %s -> %s",pcVar1,local_68._M_dataplus._M_p,local_40._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_68);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/open-goal[P]jak-disassembler/TypeSystem/GoalSymbol.h"
                    ,0x18,"void GoalSymbol::set_type(TypeSpec)");
    }
  }
  this->m_has_type_info = true;
  std::__cxx11::string::operator=((string *)&this->m_type,(string *)ts);
  local_68.field_2._M_allocated_capacity =
       (size_type)
       (this->m_type).m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  pTVar2 = (ts->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_68._M_dataplus._M_p =
       (pointer)(this->m_type).m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>.
                _M_impl.super__Vector_impl_data._M_start;
  local_68._M_string_length =
       (size_type)
       (this->m_type).m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->m_type).m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
  super__Vector_impl_data._M_start =
       (ts->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->m_type).m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = pTVar2;
  (this->m_type).m_args.super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (ts->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (ts->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (ts->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (ts->m_args).super__Vector_base<TypeSpec,_std::allocator<TypeSpec>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<TypeSpec,_std::allocator<TypeSpec>_>::~vector
            ((vector<TypeSpec,_std::allocator<TypeSpec>_> *)&local_68);
  return;
}

Assistant:

void set_type(TypeSpec ts) {
    if(m_has_type_info) {
      if(ts != m_type) {
        printf("symbol %s %s -> %s", m_name.c_str(), m_type.to_string().c_str(), ts.to_string().c_str());
        assert(false);
      }
    }

    m_has_type_info = true;
    m_type = std::move(ts);
  }